

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O3

void __thiscall Fl_Pixmap::desaturate(Fl_Pixmap *this)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char cVar7;
  char **ppcVar8;
  byte *p;
  char *__format;
  ulong uVar9;
  byte *pbVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  uchar b;
  uchar r;
  int ncolors;
  int chars_per_pixel;
  char line [255];
  byte local_14b;
  byte local_14a;
  byte local_149;
  int local_148;
  int local_144;
  Fl_Pixmap *local_140;
  char local_138 [264];
  
  (*(this->super_Fl_Image)._vptr_Fl_Image[8])();
  copy_data(this);
  __isoc99_sscanf(*(this->super_Fl_Image).data_,"%*d%*d%d%d",&local_148);
  if (local_148 < 0) {
    pcVar5 = (this->super_Fl_Image).data_[1];
    lVar12 = 0;
    do {
      cVar7 = (char)(((uint)(byte)pcVar5[lVar12 * 4 + 2] * 0x3d +
                      (uint)(byte)pcVar5[lVar12 * 4 + 1] * 0x1f +
                     (uint)(byte)pcVar5[lVar12 * 4 + 3] * 8) * 0x147b >> 0x13);
      pcVar5[lVar12 * 4 + 3] = cVar7;
      pcVar5[lVar12 * 4 + 2] = cVar7;
      pcVar5[lVar12 * 4 + 1] = cVar7;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 < -local_148);
  }
  else if (local_148 != 0) {
    lVar12 = 0;
    local_140 = this;
LAB_001c3d46:
    lVar2 = lVar12 + 1;
    lVar12 = lVar12 + 1;
    pbVar10 = (byte *)((this->super_Fl_Image).data_[lVar2] + (long)local_144 + 1);
    uVar11 = (uint)*pbVar10;
    p = pbVar10;
LAB_001c3d66:
    do {
      if ((char)uVar11 == '\0') {
        bVar13 = false;
      }
      else {
        do {
          cVar7 = (char)uVar11;
          iVar3 = isspace((int)cVar7);
          if (iVar3 == 0) goto LAB_001c3d88;
          pbVar1 = pbVar10 + 1;
          uVar11 = (uint)*pbVar1;
          pbVar10 = pbVar10 + 1;
        } while (*pbVar1 != 0);
        cVar7 = '\0';
LAB_001c3d88:
        bVar13 = cVar7 == 'c';
      }
      do {
        uVar11 = (uint)(char)pbVar10[1];
        if (uVar11 == 0) goto LAB_001c3df9;
        pbVar10 = pbVar10 + 1;
        iVar3 = isspace(uVar11);
      } while (iVar3 == 0);
      while (iVar3 = isspace((int)(char)uVar11), iVar3 != 0) {
        pbVar1 = pbVar10 + 1;
        uVar11 = (uint)*pbVar1;
        pbVar10 = pbVar10 + 1;
        if (*pbVar1 == 0) goto LAB_001c3df9;
      }
      p = pbVar10;
      if (bVar13) goto LAB_001c3df9;
      do {
        iVar3 = isspace((int)(char)uVar11);
        if (iVar3 != 0) goto LAB_001c3d66;
        pbVar1 = pbVar10 + 1;
        uVar11 = (uint)*pbVar1;
        pbVar10 = pbVar10 + 1;
      } while (*pbVar1 != 0);
      uVar11 = 0;
    } while( true );
  }
  return;
LAB_001c3df9:
  iVar3 = fl_parse_color((char *)p,&local_149,&local_14b,&local_14a);
  this = local_140;
  if (iVar3 != 0) {
    uVar11 = ((uint)local_14b * 0x3d + (uint)local_149 * 0x1f + (uint)local_14a * 8) * 0x147b >>
             0x13;
    local_14b = (byte)uVar11;
    pcVar5 = (local_140->super_Fl_Image).data_[lVar12];
    uVar9 = (ulong)uVar11;
    if (local_144 < 2) {
      __format = "%c c #%02X%02X%02X";
      uVar6 = uVar9;
    }
    else {
      __format = "%c%c c #%02X%02X%02X";
      uVar6 = (ulong)(uint)(int)pcVar5[1];
    }
    sprintf(local_138,__format,(ulong)(uint)(int)*pcVar5,uVar6,uVar9,uVar9);
    ppcVar8 = (this->super_Fl_Image).data_;
    if (ppcVar8[lVar12] != (char *)0x0) {
      operator_delete__(ppcVar8[lVar12]);
      ppcVar8 = (this->super_Fl_Image).data_;
    }
    sVar4 = strlen(local_138);
    pcVar5 = (char *)operator_new__(sVar4 + 1);
    ppcVar8[lVar12] = pcVar5;
    strcpy((this->super_Fl_Image).data_[lVar12],local_138);
  }
  if (local_148 <= lVar12) {
    return;
  }
  goto LAB_001c3d46;
}

Assistant:

void Fl_Pixmap::desaturate() {
  // Delete any existing pixmap/mask objects...
  uncache();

  // Allocate memory as needed...
  copy_data();

  // Update the colormap to grayscale...
  char		line[255];	// New colormap line
  int		i,		// Looping var
		ncolors,	// Number of colors in image
		chars_per_pixel;// Characters per color
  uchar		r, g, b;

  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);

  if (ncolors < 0) {
    // Update FLTK colormap...
    ncolors = -ncolors;
    uchar *cmap = (uchar *)(data()[1]);
    for (i = 0; i < ncolors; i ++, cmap += 4) {
      g = (uchar)((cmap[1] * 31 + cmap[2] * 61 + cmap[3] * 8) / 100);
      cmap[1] = cmap[2] = cmap[3] = g;
    }
  } else {
    // Update standard XPM colormap...
    for (i = 0; i < ncolors; i ++) {
      // look for "c word", or last word if none:
      const char *p = data()[i + 1] + chars_per_pixel + 1;
      const char *previous_word = p;
      for (;;) {
	while (*p && isspace(*p)) p++;
	char what = *p++;
	while (*p && !isspace(*p)) p++;
	while (*p && isspace(*p)) p++;
	if (!*p) {p = previous_word; break;}
	if (what == 'c') break;
	previous_word = p;
	while (*p && !isspace(*p)) p++;
      }

      if (fl_parse_color(p, r, g, b)) {
        g = (uchar)((r * 31 + g * 61 + b * 8) / 100);

        if (chars_per_pixel > 1) sprintf(line, "%c%c c #%02X%02X%02X", data()[i + 1][0],
	                                 data()[i + 1][1], g, g, g);
        else sprintf(line, "%c c #%02X%02X%02X", data()[i + 1][0], g, g, g);

        delete[] (char *)data()[i + 1];
	((char **)data())[i + 1] = new char[strlen(line) + 1];
	strcpy((char *)data()[i + 1], line);
      }
    }
  }
}